

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.hpp
# Opt level: O3

string_view __thiscall
cinatra::get_local_time_str<8ul,32ul>(cinatra *this,char (*buf) [32],time_t t,string_view format)

{
  byte bVar1;
  undefined2 *puVar2;
  bool bVar3;
  tm *ptVar4;
  size_t sVar5;
  cinatra *pcVar6;
  int iVar7;
  cinatra cVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  string_view sVar13;
  char (*local_38) [32];
  
  sVar5 = format._M_len;
  local_38 = buf;
  ptVar4 = gmtime((time_t *)&local_38);
  pcVar6 = this;
  if (t != 0) {
    uVar9 = 0;
    iVar7 = 0;
    do {
      if (*(char *)(sVar5 + uVar9) == '%') {
        uVar9 = (long)iVar7 + 2;
        cVar8 = (cinatra)0x30;
        if (uVar9 < (ulong)t) {
          cVar8 = *(cinatra *)(sVar5 + uVar9);
        }
        bVar1 = *(byte *)(sVar5 + 1 + (long)iVar7);
        iVar7 = iVar7 + 1;
        if (bVar1 < 0x61) {
          if (bVar1 < 0x53) {
            if (bVar1 == 0x48) {
              lVar11 = 1;
              iVar10 = ptVar4->tm_hour + 8;
              bVar3 = true;
              do {
                bVar12 = bVar3;
                pcVar6[lVar11] = *(cinatra *)(digits + iVar10 % 10);
                lVar11 = 0;
                iVar10 = iVar10 / 10;
                bVar3 = false;
              } while (bVar12);
            }
            else {
              if (bVar1 != 0x4d) goto LAB_00289ed4;
              lVar11 = 1;
              iVar10 = ptVar4->tm_min;
              bVar3 = true;
              do {
                bVar12 = bVar3;
                pcVar6[lVar11] = *(cinatra *)(digits + iVar10 % 10);
                lVar11 = 0;
                iVar10 = iVar10 / 10;
                bVar3 = false;
              } while (bVar12);
            }
          }
          else {
            if (bVar1 != 0x53) {
              if (bVar1 == 0x59) {
                lVar11 = 4;
                iVar10 = ptVar4->tm_year + 0x76c;
                do {
                  pcVar6[lVar11 + -1] = *(cinatra *)(digits + iVar10 % 10);
                  lVar11 = lVar11 + -1;
                  iVar10 = iVar10 / 10;
                } while (lVar11 != 0);
                pcVar6[4] = cVar8;
                goto LAB_00289e30;
              }
              goto LAB_00289ed4;
            }
            lVar11 = 1;
            iVar10 = ptVar4->tm_sec;
            bVar3 = true;
            do {
              bVar12 = bVar3;
              pcVar6[lVar11] = *(cinatra *)(digits + iVar10 % 10);
              lVar11 = 0;
              iVar10 = iVar10 / 10;
              bVar3 = false;
            } while (bVar12);
          }
        }
        else {
          if (bVar1 < 100) {
            if (bVar1 == 0x61) {
              puVar2 = *(undefined2 **)(WDAY + (long)ptVar4->tm_wday * 0x10 + 8);
              pcVar6[2] = *(cinatra *)(puVar2 + 1);
              *(undefined2 *)pcVar6 = *puVar2;
              pcVar6[3] = cVar8;
              pcVar6[4] = (cinatra)0x20;
LAB_00289e30:
              pcVar6 = pcVar6 + 5;
            }
            else if (bVar1 == 0x62) {
              puVar2 = *(undefined2 **)(YMON + (long)ptVar4->tm_mon * 0x10 + 8);
              pcVar6[2] = *(cinatra *)(puVar2 + 1);
              *(undefined2 *)pcVar6 = *puVar2;
              pcVar6[3] = cVar8;
              pcVar6 = pcVar6 + 4;
            }
            goto LAB_00289ed4;
          }
          if (bVar1 == 100) {
            lVar11 = 1;
            iVar10 = ptVar4->tm_mday;
            bVar3 = true;
            do {
              bVar12 = bVar3;
              pcVar6[lVar11] = *(cinatra *)(digits + iVar10 % 10);
              lVar11 = 0;
              iVar10 = iVar10 / 10;
              bVar3 = false;
            } while (bVar12);
          }
          else {
            if (bVar1 != 0x6d) goto LAB_00289ed4;
            lVar11 = 1;
            iVar10 = ptVar4->tm_mon + 1;
            bVar3 = true;
            do {
              bVar12 = bVar3;
              pcVar6[lVar11] = *(cinatra *)(digits + iVar10 % 10);
              lVar11 = 0;
              iVar10 = iVar10 / 10;
              bVar3 = false;
            } while (bVar12);
          }
        }
        pcVar6[2] = cVar8;
        pcVar6 = pcVar6 + 3;
      }
LAB_00289ed4:
      iVar7 = iVar7 + 1;
      uVar9 = (ulong)iVar7;
    } while (uVar9 < (ulong)t);
  }
  sVar13._M_len = pcVar6 + ~(ulong)this;
  sVar13._M_str = (char *)this;
  return sVar13;
}

Assistant:

inline std::string_view get_local_time_str(char (&buf)[N], std::time_t t,
                                           std::string_view format) {
  static_assert(N >= 20, "wrong buf");
  struct tm *loc_time = gmtime(&t);

  char *p = buf;

  for (int i = 0; i < format.size(); ++i) {
    if (format[i] == '%') {
      char c = i + 2 < format.size() ? format[i + 2] : '0';
      i++;
      if (format[i] == 'Y') {
        to_year(p, loc_time->tm_year + 1900, c);
        p += 5;
      }
      else if (format[i] == 'm') {
        to_month(p, loc_time->tm_mon + 1, c);
        p += 3;
      }
      else if (format[i] == 'd') {
        to_day(p, loc_time->tm_mday, c);
        p += 3;
      }
      else if (format[i] == 'H') {
        to_hour(p, loc_time->tm_hour + Hour, c);
        p += 3;
      }
      else if (format[i] == 'M') {
        to_min(p, loc_time->tm_min, c);
        p += 3;
      }
      else if (format[i] == 'S') {
        to_sec(p, loc_time->tm_sec, c);
        p += 3;
      }
      else if (format[i] == 'a') {
        memcpy(p, WDAY[loc_time->tm_wday].data(), 3);
        p += 3;
        *p++ = c;
        *p++ = ' ';
      }
      else if (format[i] == 'b') {
        memcpy(p, YMON[loc_time->tm_mon].data(), 3);
        p += 3;
        *p = c;
        p += 1;
      }
    }
  }

  size_t n = p - buf - 1;

  return {buf, n};
}